

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O0

FTexture * __thiscall
FTextureManager::FindTexture(FTextureManager *this,char *texname,int usetype,BITFIELD flags)

{
  bool bVar1;
  int iVar2;
  TextureHash *pTVar3;
  FTexture *local_38;
  FTextureID local_24;
  BITFIELD local_20;
  FTextureID texnum;
  BITFIELD flags_local;
  int usetype_local;
  char *texname_local;
  FTextureManager *this_local;
  
  local_20 = flags;
  texnum.texnum = usetype;
  local_24 = CheckForTexture(this,texname,usetype,flags);
  bVar1 = FTextureID::isValid(&local_24);
  if (bVar1) {
    iVar2 = FTextureID::GetIndex(&local_24);
    pTVar3 = TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::operator[]
                       (&this->Textures,(long)iVar2);
    local_38 = pTVar3->Texture;
  }
  else {
    local_38 = (FTexture *)0x0;
  }
  return local_38;
}

Assistant:

FTexture *FTextureManager::FindTexture(const char *texname, int usetype, BITFIELD flags)
{
	FTextureID texnum = CheckForTexture (texname, usetype, flags);
	return !texnum.isValid()? NULL : Textures[texnum.GetIndex()].Texture;
}